

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.h
# Opt level: O0

void __thiscall
luna::Exception::
SetWhat<char_const*&,char,char_const*&,char_const(&)[3],char_const*&,char_const(&)[6],char_const*,char_const(&)[8]>
          (Exception *this,ostringstream *oss,char **arg,char *args,char **args_1,char (*args_2) [3]
          ,char **args_3,char (*args_4) [6],char **args_5,char (*args_6) [8])

{
  Exception *in_RCX;
  undefined8 *in_RDX;
  ostream *in_RSI;
  char **in_RDI;
  ostringstream *in_R8;
  char *in_R9;
  char (*unaff_retaddr) [8];
  char **in_stack_00000020;
  char (*in_stack_ffffffffffffffc0) [3];
  char **args_4_00;
  
  args_4_00 = in_RDI;
  std::operator<<(in_RSI,(char *)*in_RDX);
  SetWhat<char,char_const*&,char_const(&)[3],char_const*&,char_const(&)[6],char_const*,char_const(&)[8]>
            (in_RCX,in_R8,in_R9,in_RDI,in_stack_ffffffffffffffc0,in_stack_00000020,
             (char (*) [6])in_RSI,args_4_00,unaff_retaddr);
  return;
}

Assistant:

void SetWhat(std::ostringstream &oss, Arg&& arg, Args&&... args)
        {
            oss << std::forward<Arg>(arg);
            SetWhat(oss, std::forward<Args>(args)...);
        }